

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# efsw-test.c
# Opt level: O1

efsw_watchid handleWatchID(efsw_watchid watchid)

{
  char *__s;
  
  if ((watchid + 7U < 7) && (watchid + 7U != 3)) {
    __s = efsw_getlasterror();
    puts(__s);
  }
  else {
    printf("Added WatchID: %ld\n",watchid);
  }
  return watchid;
}

Assistant:

efsw_watchid handleWatchID( efsw_watchid watchid ) {
	switch ( watchid ) {
		case EFSW_NOTFOUND:
		case EFSW_REPEATED:
		case EFSW_OUTOFSCOPE:
		case EFSW_REMOTE:
		case EFSW_WATCHER_FAILED:
		case EFSW_UNSPECIFIED: {
			printf( "%s\n", efsw_getlasterror() );
			break;
		}
		default: {
			printf( "Added WatchID: %ld\n", watchid );
		}
	}

	return watchid;
}